

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysex.c
# Opt level: O0

void send_multiple_test(void)

{
  int local_43c;
  int local_438;
  int count;
  int j;
  PtTimestamp stop_time;
  PtTimestamp start_time;
  int i;
  uchar msg [1024];
  PortMidiStream *local_20;
  PortMidiStream *midi_out;
  int local_10;
  int num_msgs;
  int length;
  int outp;
  
  Pt_Start(1,(PtCallback *)0x0,(void *)0x0);
  printf("This is for performance testing. You should be sending to this\n");
  printf("program running the receive multiple test. Do NOT send to\n");
  printf("a synthesizer or you risk reprogramming it\n");
  num_msgs = get_number("Type output device number: ");
  do {
    latency = get_number(
                        "Latency in milliseconds (0 to send data immediatedly,\n  >0 to send timestamped messages): "
                        );
  } while (latency < 0);
  Pm_OpenOutput(&local_20,num_msgs,(void *)0x0,0,(PmTimeProcPtr)0x0,(void *)0x0,latency);
  do {
    local_10 = get_number("Message length (7 - 1024): ");
  } while (local_10 < 7 || 0x400 < local_10);
  do {
    midi_out._4_4_ = get_number("Number of messages: ");
  } while (midi_out._4_4_ < 1);
  start_time._0_1_ = 0xf0;
  for (stop_time = 6; stop_time < local_10 + -1; stop_time = stop_time + 1) {
    *(char *)((long)&start_time + (long)stop_time) = (char)(stop_time % 0x80);
  }
  *(undefined1 *)((long)&start_time + (long)(local_10 + -1)) = 0xf7;
  Pt_Time();
  for (stop_time = midi_out._4_4_; 0 < stop_time; stop_time = stop_time + -1) {
    local_43c = stop_time;
    for (local_438 = 1; local_438 < 6; local_438 = local_438 + 1) {
      *(byte *)((long)&start_time + (long)local_438) = (byte)local_43c & 0x7f;
      local_43c = local_43c >> 7;
    }
    Pm_WriteSysEx(local_20,0,(uchar *)&start_time);
  }
  Pt_Time();
  Pm_Close(local_20);
  return;
}

Assistant:

void send_multiple_test()
{
    int outp;
    int length;
    int num_msgs;
    PmStream *midi_out;
    unsigned char msg[1024];
    int i;
    PtTimestamp start_time;
    PtTimestamp stop_time;

    Pt_Start(1, 0, 0);
    
    printf("This is for performance testing. You should be sending to this\n");
    printf("program running the receive multiple test. Do NOT send to\n");
    printf("a synthesizer or you risk reprogramming it\n");
    outp = get_number("Type output device number: ");
    while ((latency = get_number(
                     "Latency in milliseconds (0 to send data immediatedly,\n"
                     "  >0 to send timestamped messages): ")) < 0);
    Pm_OpenOutput(&midi_out, outp, NULL, 0, NULL, NULL, latency);
    while ((length = get_number("Message length (7 - 1024): ")) < 7 ||
           length > 1024) ;
    while ((num_msgs = get_number("Number of messages: ")) < 1);
    /* latency, length, and num_msgs should now all be valid */
    /* compose the message except for sequence number in first 5 bytes */
    msg[0] = (char) MIDI_SYSEX;
    for (i = 6; i < length - 1; i++) {
        msg[i] = i % 128; /* this is just filler */
    }
    msg[length - 1] = (char) MIDI_EOX;

    start_time = Pt_Time();
    /* send the messages */
    for (i = num_msgs; i > 0; i--) {
        /* insert sequence number into first 5 data bytes */
        /* sequence counts down to zero */
        int j;
        int count = i;
        /* 7 bits of message count i goes into each data byte */
        for (j = 1; j <= 5; j++) {
            msg[j] = count & 127;
            count >>= 7;
        }
        /* send the message */
        Pm_WriteSysEx(midi_out, 0, msg);
    }
    stop_time = Pt_Time();
    Pm_Close(midi_out);
    return;
}